

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O2

void ut::are_equal<unsigned_char,130ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
               (uchar (*expected) [130],
               vector<unsigned_char,_std::allocator<unsigned_char>_> *actual,LocationInfo *location)

{
  bool value;
  unsigned_long local_30 [2];
  
  local_30[1] = 0x82;
  local_30[0] = (long)(actual->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(actual->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start;
  are_equal<unsigned_long,unsigned_long>(local_30 + 1,local_30,location);
  value = std::__equal<true>::equal<unsigned_char>
                    (*expected,expected[1],
                     (actual->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start);
  is_true(value,location);
  return;
}

Assistant:

inline void are_equal(T (&expected)[n], const ContainerT &actual, const LocationInfo &location)
	{
		are_equal(n, static_cast<size_t>(std::distance(actual.begin(), actual.end())), location);
		is_true(std::equal(expected, expected + n, actual.begin()), location);
	}